

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int entropy_update(mbedtls_entropy_context *ctx,uchar source_id,uchar *data,size_t len)

{
  size_t *local_88;
  uchar *p;
  size_t use_len;
  uchar tmp [64];
  uchar local_2a;
  undefined1 local_29;
  size_t sStack_28;
  uchar header [2];
  size_t len_local;
  uchar *data_local;
  uchar source_id_local;
  mbedtls_entropy_context *ctx_local;
  
  local_88 = (size_t *)data;
  p = (uchar *)len;
  sStack_28 = len;
  if (0x40 < len) {
    mbedtls_sha512(data,len,(uchar *)&use_len,0);
    local_88 = &use_len;
    p = (uchar *)0x40;
  }
  local_29 = SUB81(p,0);
  local_2a = source_id;
  mbedtls_sha512_update(&ctx->accumulator,&local_2a,2);
  mbedtls_sha512_update(&ctx->accumulator,(uchar *)local_88,(size_t)p);
  return 0;
}

Assistant:

static int entropy_update( mbedtls_entropy_context *ctx, unsigned char source_id,
                           const unsigned char *data, size_t len )
{
    unsigned char header[2];
    unsigned char tmp[MBEDTLS_ENTROPY_BLOCK_SIZE];
    size_t use_len = len;
    const unsigned char *p = data;

    if( use_len > MBEDTLS_ENTROPY_BLOCK_SIZE )
    {
#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
        mbedtls_sha512( data, len, tmp, 0 );
#else
        mbedtls_sha256( data, len, tmp, 0 );
#endif
        p = tmp;
        use_len = MBEDTLS_ENTROPY_BLOCK_SIZE;
    }

    header[0] = source_id;
    header[1] = use_len & 0xFF;

#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    mbedtls_sha512_update( &ctx->accumulator, header, 2 );
    mbedtls_sha512_update( &ctx->accumulator, p, use_len );
#else
    mbedtls_sha256_update( &ctx->accumulator, header, 2 );
    mbedtls_sha256_update( &ctx->accumulator, p, use_len );
#endif

    return( 0 );
}